

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

void __thiscall
boost::python::
class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
::
initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
          (class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
           *this,init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                 *i)

{
  class_<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  *in_RSI;
  class_base *in_RDI;
  
  objects::
  class_metadata<LFPConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
  ::register_();
  objects::class_base::set_instance_size(in_RDI,0x458);
  def<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            (in_RSI,(def_visitor<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                     *)in_RDI);
  return;
}

Assistant:

inline void initialize(DefVisitor const& i)
    {
        metadata::register_(); // set up runtime metadata/conversions
        
        typedef typename metadata::holder holder;
        this->set_instance_size( objects::additional_instance_size<holder>::value );
        
        this->def(i);
    }